

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcxtexture.cpp
# Opt level: O0

void __thiscall
FPCXTexture::ReadPCX24bits(FPCXTexture *this,BYTE *dst,FileReader *lump,PCXHeader *hdr,int planes)

{
  long lVar1;
  BYTE *pBVar2;
  byte *pbVar3;
  BYTE *local_58;
  BYTE *ptr;
  BYTE *src;
  BYTE *srcp;
  int bytes;
  int c;
  int y;
  int rle_value;
  int rle_count;
  int planes_local;
  PCXHeader *hdr_local;
  FileReader *lump_local;
  BYTE *dst_local;
  FPCXTexture *this_local;
  
  y = 0;
  c = 0;
  lVar1 = FileReader::GetLength(lump);
  pBVar2 = (BYTE *)operator_new__(lVar1 - 0x80);
  lVar1 = FileReader::GetLength(lump);
  (*(lump->super_FileReaderBase)._vptr_FileReaderBase[2])(lump,pBVar2,lVar1 + -0x80);
  ptr = pBVar2;
  for (bytes = 0; bytes < (int)(uint)(this->super_FTexture).Height; bytes = bytes + 1) {
    for (srcp._4_4_ = 0; srcp._4_4_ < planes; srcp._4_4_ = srcp._4_4_ + 1) {
      local_58 = dst + (int)(bytes * (uint)(this->super_FTexture).Width * planes);
      srcp._0_4_ = (uint)hdr->bytesPerScanLine;
      while ((uint)srcp != 0) {
        if (y == 0) {
          pbVar3 = ptr + 1;
          c = (int)*ptr;
          if ((uint)c < 0xc0) {
            y = 1;
            ptr = pbVar3;
          }
          else {
            y = c - 0xc0;
            ptr = ptr + 2;
            c = (int)*pbVar3;
          }
        }
        y = y + -1;
        local_58[srcp._4_4_] = (BYTE)c;
        local_58 = local_58 + planes;
        srcp._0_4_ = (uint)srcp - 1;
      }
    }
  }
  if (pBVar2 != (BYTE *)0x0) {
    operator_delete__(pBVar2);
  }
  return;
}

Assistant:

void FPCXTexture::ReadPCX24bits (BYTE *dst, FileReader & lump, PCXHeader *hdr, int planes)
{
	int rle_count = 0, rle_value = 0;
	int y, c;
	int bytes;

	BYTE * srcp = new BYTE[lump.GetLength() - sizeof(PCXHeader)];
	lump.Read(srcp, lump.GetLength() - sizeof(PCXHeader));
	BYTE * src = srcp;

	for (y = 0; y < Height; ++y)
	{
		/* for each color plane */
		for (c = 0; c < planes; ++c)
		{
			BYTE * ptr = &dst[y * Width * planes];
			bytes = hdr->bytesPerScanLine;

			while (bytes--)
			{
				if (rle_count == 0)
				{
					if( (rle_value = *src++) < 0xc0)
					{
						rle_count = 1;
					}
					else
					{
						rle_count = rle_value - 0xc0;
						rle_value = *src++;
					}
				}

				rle_count--;
				ptr[c] = (BYTE)rle_value;
				ptr += planes;
			}
		}
	}
	delete [] srcp;
}